

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_WasmPrintFunc(InterpreterStackFrame *this,int regIndex)

{
  uint index;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  void *pvVar5;
  WasmFunctionInfo *pWVar6;
  
  if ((*(byte *)(*(long *)(this + 0x88) + 0x46) & 8) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x2578,"(m_functionBody->IsWasmFunction())",
                                "m_functionBody->IsWasmFunction()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  index = *(uint *)(*(long *)(this + 0x118) + (long)regIndex * 4);
  pvVar5 = FunctionProxy::GetAuxPtr(*(FunctionProxy **)(this + 0x88),AsmJsFunctionInfo);
  pWVar6 = WebAssemblyModule::GetWasmFunctionInfo
                     (*(WebAssemblyModule **)((long)pvVar5 + 0x98),index);
  uVar3 = WAsmJs::Tracing::GetPrintCol();
  if (0 < (int)uVar3) {
    Output::SkipToColumn((ulong)uVar3);
  }
  FunctionBody::DumpFullFunctionName((pWVar6->m_body).ptr);
  Output::Print(L"(");
  return;
}

Assistant:

void InterpreterStackFrame::OP_WasmPrintFunc(int regIndex)
    {
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS) && defined(ENABLE_WASM)
        Assert(m_functionBody->IsWasmFunction());
        uint index = GetRegRawInt(regIndex);
        Wasm::WasmFunctionInfo* info = m_functionBody->GetAsmJsFunctionInfo()->GetWebAssemblyModule()->GetWasmFunctionInfo(index);
        int col = WAsmJs::Tracing::GetPrintCol();
        if (col > 0)
        {
            Output::SkipToColumn(col);
        }
        info->GetBody()->DumpFullFunctionName();
        Output::Print(_u("("));
#endif
    }